

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_frsqrt_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  float32 fVar7;
  float32 fVar8;
  float64 fVar9;
  float64 fVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float_status *status;
  long lVar16;
  bool bVar17;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar16 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = float32_sqrt_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar16 * 4 + lVar4 + -0x228),pfVar2)
      ;
      fVar7 = float32_div_mips(0x3f800000,fVar7,pfVar2);
      *(float32 *)((long)local_40 + lVar16 * 4) = fVar7;
      fVar8 = float32_sqrt_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar16 * 4 + lVar4 + -0x228),pfVar2)
      ;
      bVar17 = true;
      if ((fVar8 & 0x7fffffff) != 0x7f800000) {
        iVar5 = float32_is_quiet_nan_mips(fVar7,pfVar2);
        bVar17 = iVar5 != 0;
      }
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar15 = (uint)bVar3;
      if ((fVar7 & 0x7f800000) == 0) {
        uVar15 = uVar15 | 0x10;
      }
      if ((fVar7 & 0x7fffffff) == 0) {
        uVar15 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar12 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar12 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar12 = uVar14;
      }
      uVar12 = uVar12 | uVar6;
      uVar14 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar13 = uVar14 | uVar12;
      uVar15 = uVar6 & 0xfffffffc;
      if ((uVar14 != 0 || (uVar12 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar13;
      }
      if ((uVar12 & 2) == 0) {
        uVar15 = uVar13;
      }
      uVar12 = 1;
      if ((uVar15 & 0x18) != 0) {
        uVar12 = uVar15;
      }
      if (bVar17) {
        uVar12 = uVar15;
      }
      if ((uVar12 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar12 << 0xc;
LAB_00779733:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar11;
      }
      else if ((uVar11 >> 0x12 & 1) == 0) {
        uVar15 = uVar12 << 0xc | uVar11;
        uVar11 = uVar11 & 0xfff80fff;
        goto LAB_00779733;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar12) != 0) {
        fVar7 = float32_default_nan_mips(pfVar2);
        *(float32 *)((long)local_40 + lVar16 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar12;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1b89,
                    "void helper_msa_frsqrt_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar16 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float64_sqrt_mips(*(float64 *)
                                 ((long)(env->active_fpu).fpr + lVar16 * 8 + lVar4 + -0x228),pfVar2)
      ;
      fVar9 = float64_div_mips(0x3ff0000000000000,fVar9,pfVar2);
      local_40[lVar16] = fVar9;
      fVar10 = float64_sqrt_mips(*(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 8 + lVar4 + -0x228),pfVar2
                                );
      bVar17 = true;
      if ((fVar10 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        iVar5 = float64_is_quiet_nan_mips(fVar9,pfVar2);
        bVar17 = iVar5 != 0;
      }
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar15 = (uint)bVar3;
      if ((fVar9 & 0x7ff0000000000000) == 0) {
        uVar15 = uVar15 | 0x10;
      }
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar15 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar12 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar12 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar12 = uVar14;
      }
      uVar12 = uVar12 | uVar6;
      uVar13 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar14 = uVar13 | uVar12;
      uVar15 = uVar6 & 0xfffffffc;
      if ((uVar13 != 0 || (uVar12 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar14;
      }
      if ((uVar12 & 2) == 0) {
        uVar15 = uVar14;
      }
      uVar12 = 1;
      if ((uVar15 & 0x18) != 0) {
        uVar12 = uVar15;
      }
      if (bVar17) {
        uVar12 = uVar15;
      }
      if ((uVar12 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar12 << 0xc;
LAB_007795ac:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar11;
      }
      else if ((uVar11 >> 0x12 & 1) == 0) {
        uVar15 = uVar12 << 0xc | uVar11;
        uVar11 = uVar11 & 0xfff80fff;
        goto LAB_007795ac;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar12) != 0) {
        fVar9 = float64_default_nan_mips(pfVar2);
        local_40[lVar16] = (long)(int)uVar12 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 == 1);
  }
  uVar15 = (env->active_tc).msacsr;
  uVar11 = uVar15 >> 7 & 0x1f | 0x20;
  if ((uVar11 & uVar15 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar11);
  }
  (env->active_tc).msacsr = (uVar15 >> 0xc & 0x1f) << 2 | uVar15;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_frsqrt_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->w[i], float32_sqrt(pws->w[i],
                    &env->active_tc.msa_fp_status), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->d[i], float64_sqrt(pws->d[i],
                    &env->active_tc.msa_fp_status), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}